

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void read_save(void)

{
  FILE *__stream;
  
  if (state_buffer == (void *)0x0) {
    __stream = fopen(save_path,"rb");
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      state_buffer_size = ftell(__stream);
      state_buffer = malloc(state_buffer_size);
      fseek(__stream,0,0);
      fread(state_buffer,1,state_buffer_size,__stream);
      fclose(__stream);
      return;
    }
  }
  return;
}

Assistant:

void read_save()
{
    if (!state_buffer)
    {
        FILE* file = fopen(save_path, "rb");
        if (file)
        {
            fseek(file, 0, SEEK_END);
            state_buffer_size = ftell(file);
            state_buffer = malloc(state_buffer_size);

            fseek(file, 0, SEEK_SET);

            fread(state_buffer, 1, state_buffer_size, file);
            fclose(file);
        }
    }
}